

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O1

void __thiscall minihttp::TcpSocket::TcpSocket(TcpSocket *this)

{
  this->_vptr_TcpSocket = (_func_int **)&PTR__TcpSocket_0010dc48;
  this->_inbufSize = 0;
  this->_recvSize = 0;
  this->_lastport = 0;
  this->_inbuf = (char *)0x0;
  this->_readptr = (char *)0x0;
  this->_s = -1;
  (this->_host)._M_dataplus._M_p = (pointer)&(this->_host).field_2;
  (this->_host)._M_string_length = 0;
  (this->_host).field_2._M_local_buf[0] = '\0';
  this->_sslctx = (void *)0x0;
  return;
}

Assistant:

TcpSocket::TcpSocket()
	: _inbuf(NULL)
	, _readptr(NULL)
	, _inbufSize(0)
	, _recvSize(0)
	, _lastport(0)
	, _s(INVALID_SOCKET)
	, _sslctx(NULL)
{
#ifdef MINIHTTP_USE_MBEDTLS
    mbedtls_net_init((mbedtls_net_context*)&_s);
#endif
}